

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<QFont::Tag>::
appendIteratorRange<QHash<QFont::Tag,unsigned_int>::key_iterator>
          (QCommonArrayOps<QFont::Tag> *this,key_iterator b,key_iterator e,
          IfIsForwardIterator<QHash<QFont::Tag,_unsigned_int>::key_iterator> param_3)

{
  qsizetype *pqVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<QFont::Tag,_unsigned_int>_> *pDVar3;
  Tag *pTVar4;
  long in_FS_OFFSET;
  iterator<QHashPrivate::Node<QFont::Tag,_unsigned_int>_> local_48;
  long local_38;
  
  uVar2 = b.i.i.bucket;
  pDVar3 = b.i.i.d;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = pDVar3;
  local_48.bucket = uVar2;
  std::__distance<QHash<QFont::Tag,unsigned_int>::key_iterator>(pDVar3,uVar2,e.i.i.d,e.i.i.bucket);
  pTVar4 = (this->super_Type).super_QGenericArrayOps<QFont::Tag>.super_QArrayDataPointer<QFont::Tag>
           .ptr + (this->super_Type).super_QGenericArrayOps<QFont::Tag>.
                  super_QArrayDataPointer<QFont::Tag>.size;
  while (uVar2 != e.i.i.bucket || pDVar3 != e.i.i.d) {
    pTVar4->m_value =
         *(quint32 *)
          pDVar3->spans[uVar2 >> 7].entries[pDVar3->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f]].
          storage.data;
    pqVar1 = &(this->super_Type).super_QGenericArrayOps<QFont::Tag>.
              super_QArrayDataPointer<QFont::Tag>.size;
    *pqVar1 = *pqVar1 + 1;
    pTVar4 = pTVar4 + 1;
    QHashPrivate::iterator<QHashPrivate::Node<QFont::Tag,_unsigned_int>_>::operator++(&local_48);
    pDVar3 = local_48.d;
    uVar2 = local_48.bucket;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }